

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnView::setModel(QColumnView *this,QAbstractItemModel *model)

{
  QColumnViewPrivate *pQVar1;
  QAbstractItemModel *in_RSI;
  long in_FS_OFFSET;
  QColumnViewPrivate *unaff_retaddr;
  QColumnViewPrivate *d;
  QAbstractItemModel *in_stack_00000118;
  QAbstractItemView *in_stack_00000120;
  undefined1 in_stack_fffffffffffffff7;
  QModelIndex *parent;
  
  parent = *(QModelIndex **)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QColumnView *)0x86203f);
  if (in_RSI != (pQVar1->super_QAbstractItemViewPrivate).model) {
    QModelIndex::QModelIndex((QModelIndex *)0x86206c);
    QColumnViewPrivate::closeColumns(unaff_retaddr,parent,(bool)in_stack_fffffffffffffff7);
    QAbstractItemView::setModel(in_stack_00000120,in_stack_00000118);
  }
  if (*(QModelIndex **)(in_FS_OFFSET + 0x28) != parent) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnView::setModel(QAbstractItemModel *model)
{
    Q_D(QColumnView);
    if (model == d->model)
        return;
    d->closeColumns();
    QAbstractItemView::setModel(model);
}